

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

VRAnyCoreType __thiscall
MinVR::VRDataIndex::getValue(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  bool bVar1;
  int iVar2;
  const_iterator whereLine;
  ulong uVar3;
  allocator<char> *__a;
  undefined8 uVar4;
  pointer ppVar5;
  VRDatum *pVVar6;
  undefined4 extraout_var;
  byte in_CL;
  string *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  iterator p;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
  *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  allocator<char> *in_stack_fffffffffffffdb0;
  undefined1 in_stack_ffffffffffffff47;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  VRDataIndex *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff88;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  VRError *in_stack_ffffffffffffffb0;
  iterator local_30;
  byte local_21;
  
  local_21 = in_CL & 1;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb0,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       _getEntry(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (bool)in_stack_ffffffffffffff47);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
  ::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
              *)&stack0xffffffffffffff98,&local_30);
  whereLine = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>_>
              ::end(in_stack_fffffffffffffd78);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffff98,(_Self *)&stack0xffffffffffffff90);
  if (!bVar1) {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRDatumPtr>_>
                           *)0x12537c);
    pVVar6 = VRDatumPtr::operator->(&ppVar5->second);
    iVar2 = (*pVVar6->_vptr_VRDatum[3])();
    return (VRAnyCoreType)(VRDatum_conflict *)CONCAT44(extraout_var,iVar2);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uVar4 = __cxa_allocate_exception(0xa8);
    std::operator+(in_RSI,in_RDI);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)in_RDX,in_stack_fffffffffffffdb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)in_RDX,in_stack_fffffffffffffdb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RDI,(char *)in_RDX,in_stack_fffffffffffffdb0);
    VRError::VRError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     (string *)in_stack_ffffffffffffff98._M_node,(int *)whereLine._M_node,
                     in_stack_ffffffffffffff88);
    __cxa_throw(uVar4,&VRError::typeinfo,VRError::~VRError);
  }
  __a = (allocator<char> *)__cxa_allocate_exception(0xa8);
  std::operator+(in_RSI,in_RDI);
  std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)in_RDX,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)in_RDX,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)in_RDX,__a);
  VRError::VRError(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   (string *)in_stack_ffffffffffffff98._M_node,(int *)whereLine._M_node,
                   in_stack_ffffffffffffff88);
  __cxa_throw(__a,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRAnyCoreType getValue(const std::string &key,
                         const std::string nameSpace = "",
                         const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      if (nameSpace.empty()) {
        VRERRORNOADV("Never heard of " + key + ".");
      } else {
        VRERRORNOADV("Never heard of " + key + " in namespace " + nameSpace + ".");
      }
    } else {
      return p->second->getValue();
    }
  }